

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v128 __thiscall simd_test_avx2::c_imm_v128_shr_n_s8<3>(simd_test_avx2 *this,c_v128 a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  c_v128 cVar6;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = a.u64[0];
  auVar2 = vpsrlw_avx(auVar2,3);
  auVar4[8] = 0x1f;
  auVar4._0_8_ = 0x1f1f1f1f1f1f1f1f;
  auVar4[9] = 0x1f;
  auVar4[10] = 0x1f;
  auVar4[0xb] = 0x1f;
  auVar4[0xc] = 0x1f;
  auVar4[0xd] = 0x1f;
  auVar4[0xe] = 0x1f;
  auVar4[0xf] = 0x1f;
  auVar5[8] = 0x10;
  auVar5._0_8_ = 0x1010101010101010;
  auVar5[9] = 0x10;
  auVar5[10] = 0x10;
  auVar5[0xb] = 0x10;
  auVar5[0xc] = 0x10;
  auVar5[0xd] = 0x10;
  auVar5[0xe] = 0x10;
  auVar5[0xf] = 0x10;
  auVar2 = vpand_avx(auVar2,auVar4);
  auVar1 = vpsubb_avx(auVar2 ^ auVar5,auVar5);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this;
  auVar2 = vpsrlw_avx(auVar3,3);
  auVar2 = vpand_avx(auVar2,auVar4);
  auVar2 = vpsubb_avx(auVar2 ^ auVar5,auVar5);
  cVar6.u64[1] = auVar1._0_8_;
  cVar6.u64[0] = auVar2._0_8_;
  return cVar6;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_s8(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 7) {
    fprintf(stderr, "Error: Undefined s8 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 8; c++) t.s8[c] = a.s8[c] >> n;
  return t;
}